

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::draw_sms
          (Base<(TI::TMS::Personality)3> *this,int start,int end,uint32_t cram_dot)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  int *piVar4;
  array<unsigned_int,_16UL> *palette;
  int local_488;
  int local_484;
  int c_3;
  int local_47c;
  int c_2;
  int c_1;
  int palette_offset;
  int local_46c;
  int length;
  int pixels_left;
  int byte_column;
  int shift;
  uint8_t *pattern_index;
  int local_450;
  uint32_t pattern;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  int c;
  int tile_offset;
  int tile_end;
  int tile_start;
  value_type *line_buffer;
  int colour_buffer [256];
  uint32_t cram_dot_local;
  int end_local;
  int start_local;
  Base<(TI::TMS::Personality)3> *this_local;
  
  _tile_end = this->draw_line_buffer_;
  iVar3 = start;
  local_43c = start;
  c = end;
  tile_offset = start;
  if ((0xf < (this->output_pointer_).row) ||
     (iVar3 = start,
     ((this->super_Storage<(TI::TMS::Personality)3,_void>).horizontal_scroll_lock_ & 1U) == 0)) {
    while (local_440 = iVar3, local_440 < (int)(_tile_end->latched_horizontal_scroll & 7)) {
      colour_buffer[(long)local_440 + -2] = this->background_colour_ + 0x10;
      local_43c = local_43c + 1;
      iVar3 = local_440 + 1;
    }
    local_444 = start - (_tile_end->latched_horizontal_scroll & 7);
    local_448 = 0;
    piVar4 = std::max<int>(&local_444,&local_448);
    tile_offset = *piVar4;
    pattern = end - (_tile_end->latched_horizontal_scroll & 7);
    local_450 = 0;
    piVar4 = std::max<int>((int *)&pattern,&local_450);
    c = *piVar4;
  }
  _byte_column = (byte *)((long)&pattern_index + 4);
  if (tile_offset < end) {
    pixels_left = tile_offset & 7;
    length = tile_offset >> 3;
    local_46c = c - tile_offset;
    c_1 = 8 - pixels_left;
    piVar4 = std::min<int>(&local_46c,&c_1);
    palette_offset = *piVar4;
    uVar1 = *(uint *)((long)&_tile_end->field_5 + (long)length * 4 + 0x20);
    if (((_tile_end->field_5).bitmap[length] & 2) == 0) {
      pattern_index._4_4_ = uVar1 << ((byte)pixels_left & 0x1f);
    }
    else {
      pattern_index._4_4_ = uVar1 >> ((byte)pixels_left & 0x1f);
    }
    while( true ) {
      c_2 = ((_tile_end->field_5).bitmap[length] & 0x18) << 1;
      if (((_tile_end->field_5).bitmap[length] & 2) == 0) {
        for (c_3 = 0; c_3 < palette_offset; c_3 = c_3 + 1) {
          colour_buffer[(long)local_43c + -2] =
               (int)(_byte_column[3] & 0x80) >> 4 | (int)(_byte_column[2] & 0x80) >> 5 |
               (int)(_byte_column[1] & 0x80) >> 6 | (int)(*_byte_column & 0x80) >> 7 | c_2;
          local_43c = local_43c + 1;
          pattern_index._4_4_ = pattern_index._4_4_ << 1;
        }
      }
      else {
        for (local_47c = 0; local_47c < palette_offset; local_47c = local_47c + 1) {
          colour_buffer[(long)local_43c + -2] =
               (_byte_column[3] & 1) << 3 | (_byte_column[2] & 1) << 2 | (_byte_column[1] & 1) << 1
               | *_byte_column & 1 | c_2;
          local_43c = local_43c + 1;
          pattern_index._4_4_ = pattern_index._4_4_ >> 1;
        }
      }
      local_46c = local_46c - palette_offset;
      if (local_46c == 0) break;
      local_484 = 8;
      piVar4 = std::min<int>(&local_484,&local_46c);
      palette_offset = *piVar4;
      length = length + 1;
      pattern_index._4_4_ = *(uint *)((long)&_tile_end->field_5 + (long)length * 4 + 0x20);
    }
    local_46c = 0;
  }
  palette = Base<(TI::TMS::Personality)3>::palette(this);
  draw_sprites<(TI::TMS::SpriteMode)2,false>(this,'\0',start,end,palette,(int *)&line_buffer);
  this->pixel_target_[start] =
       (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
       [(int)(colour_buffer[(long)start + -2] & 0x1f)] | cram_dot;
  for (local_488 = start + 1; local_488 < end; local_488 = local_488 + 1) {
    this->pixel_target_[local_488] =
         (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
         [(int)(colour_buffer[(long)local_488 + -2] & 0x1f)];
  }
  if ((end == 0x100) &&
     (((this->super_Storage<(TI::TMS::Personality)3,_void>).hide_left_column_ & 1U) != 0)) {
    uVar2 = (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
            [(int)(this->background_colour_ + 0x10)];
    this->pixel_origin_[7] = uVar2;
    this->pixel_origin_[6] = uVar2;
    this->pixel_origin_[5] = uVar2;
    this->pixel_origin_[4] = uVar2;
    this->pixel_origin_[3] = uVar2;
    this->pixel_origin_[2] = uVar2;
    this->pixel_origin_[1] = uVar2;
    *this->pixel_origin_ = uVar2;
  }
  return;
}

Assistant:

void Base<personality>::draw_sms([[maybe_unused]] int start, [[maybe_unused]] int end, [[maybe_unused]] uint32_t cram_dot) {
	if constexpr (is_sega_vdp(personality)) {
		int colour_buffer[256];
		auto &line_buffer = *draw_line_buffer_;

		/*
			Add extra border for any pixels that fall before the fine scroll.
		*/
		int tile_start = start, tile_end = end;
		int tile_offset = start;
		if(output_pointer_.row >= 16 || !Storage<personality>::horizontal_scroll_lock_) {
			for(int c = start; c < (line_buffer.latched_horizontal_scroll & 7); ++c) {
				colour_buffer[c] = 16 + background_colour_;
				++tile_offset;
			}

			// Remove the border area from that to which tiles will be drawn.
			tile_start = std::max(start - (line_buffer.latched_horizontal_scroll & 7), 0);
			tile_end = std::max(end - (line_buffer.latched_horizontal_scroll & 7), 0);
		}


		uint32_t pattern;
		uint8_t *const pattern_index = reinterpret_cast<uint8_t *>(&pattern);

		/*
			Add background tiles; these will fill the colour_buffer with values in which
			the low five bits are a palette index, and bit six is set if this tile has
			priority over sprites.
		*/
		if(tile_start < end) {
			const int shift = tile_start & 7;
			int byte_column = tile_start >> 3;
			int pixels_left = tile_end - tile_start;
			int length = std::min(pixels_left, 8 - shift);

			pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			if(line_buffer.tiles.flags[byte_column]&2)
				pattern >>= shift;
			else
				pattern <<= shift;

			while(true) {
				const int palette_offset = (line_buffer.tiles.flags[byte_column]&0x18) << 1;
				if(line_buffer.tiles.flags[byte_column]&2) {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x01) << 3) |
							((pattern_index[2] & 0x01) << 2) |
							((pattern_index[1] & 0x01) << 1) |
							((pattern_index[0] & 0x01) << 0) |
							palette_offset;
						++tile_offset;
						pattern >>= 1;
					}
				} else {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x80) >> 4) |
							((pattern_index[2] & 0x80) >> 5) |
							((pattern_index[1] & 0x80) >> 6) |
							((pattern_index[0] & 0x80) >> 7) |
							palette_offset;
						++tile_offset;
						pattern <<= 1;
					}
				}

				pixels_left -= length;
				if(!pixels_left) break;

				length = std::min(8, pixels_left);
				byte_column++;
				pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			}
		}

		/*
			Apply sprites (if any).
		*/
		draw_sprites<SpriteMode::MasterSystem, false>(0, start, end, palette(), colour_buffer);	// TODO provide good y, as per elsewhere.

		// Map from the 32-colour buffer to real output pixels, applying the specific CRAM dot if any.
		pixel_target_[start] = Storage<personality>::colour_ram_[colour_buffer[start] & 0x1f] | cram_dot;
		for(int c = start+1; c < end; ++c) {
			pixel_target_[c] = Storage<personality>::colour_ram_[colour_buffer[c] & 0x1f];
		}

		// If the VDP is set to hide the left column and this is the final call that'll come
		// this line, hide it.
		if(end == 256) {
			if(Storage<personality>::hide_left_column_) {
				pixel_origin_[0] = pixel_origin_[1] = pixel_origin_[2] = pixel_origin_[3] =
				pixel_origin_[4] = pixel_origin_[5] = pixel_origin_[6] = pixel_origin_[7] =
					Storage<personality>::colour_ram_[16 + background_colour_];
			}
		}
	}
}